

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationPReLU * __thiscall
CoreML::Specification::ActivationParams::mutable_prelu(ActivationParams *this)

{
  bool bVar1;
  ActivationPReLU *this_00;
  ActivationParams *this_local;
  
  bVar1 = has_prelu(this);
  if (!bVar1) {
    clear_NonlinearityType(this);
    set_has_prelu(this);
    this_00 = (ActivationPReLU *)operator_new(0x20);
    ActivationPReLU::ActivationPReLU(this_00);
    (this->NonlinearityType_).prelu_ = this_00;
  }
  return (ActivationPReLU *)(this->NonlinearityType_).linear_;
}

Assistant:

inline ::CoreML::Specification::ActivationPReLU* ActivationParams::mutable_prelu() {
  if (!has_prelu()) {
    clear_NonlinearityType();
    set_has_prelu();
    NonlinearityType_.prelu_ = new ::CoreML::Specification::ActivationPReLU;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.PReLU)
  return NonlinearityType_.prelu_;
}